

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O2

void __thiscall
tchecker::local_array_statement_t::local_array_statement_t
          (local_array_statement_t *this,void **vtt,
          shared_ptr<const_tchecker::var_expression_t> *variable,
          shared_ptr<const_tchecker::expression_t> *size)

{
  void *pvVar1;
  invalid_argument *this_00;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x38)) = vtt[1];
  std::__shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_variable).
              super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>,
             &variable->
              super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_size).
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>,
             &size->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>);
  if ((this->_variable).
      super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr local variable");
  }
  else {
    if ((this->_size).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr size");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

local_array_statement_t::local_array_statement_t(std::shared_ptr<tchecker::var_expression_t const> const & variable,
                                                 std::shared_ptr<tchecker::expression_t const> const & size)
    : _variable(variable), _size(size)
{
  if (_variable.get() == nullptr)
    throw std::invalid_argument("nullptr local variable");
  if (_size.get() == nullptr)
    throw std::invalid_argument("nullptr size");
}